

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-barrier.c
# Opt level: O1

int run_test_barrier_2(void)

{
  int iVar1;
  int extraout_EAX;
  uv_barrier_t *unaff_RBX;
  uv_barrier_t *barrier;
  long lVar2;
  uv_thread_t thread;
  worker_config wc;
  uv_barrier_t uStack_e8;
  uv_barrier_t uStack_c8;
  uv_barrier_t *puStack_a8;
  uv_thread_t uStack_88;
  uv_barrier_t uStack_80;
  undefined8 uStack_60;
  uint uStack_58;
  uint uStack_54;
  uv_barrier_t *puStack_50;
  uv_thread_t local_40;
  uv_barrier_t local_38;
  undefined8 local_18;
  uint uStack_10;
  uint uStack_c;
  
  uStack_10 = 0;
  uStack_c = 0;
  local_38._16_8_ = 0;
  local_38._24_8_ = 0;
  local_38.__align = 0;
  local_38._8_8_ = 0;
  local_18 = 100;
  puStack_50 = (uv_barrier_t *)0x149e1a;
  iVar1 = uv_barrier_init(&local_38,2);
  if (iVar1 == 0) {
    puStack_50 = (uv_barrier_t *)0x149e34;
    iVar1 = uv_thread_create(&local_40,worker,&local_38);
    if (iVar1 != 0) goto LAB_00149e7b;
    unaff_RBX = &local_38;
    puStack_50 = (uv_barrier_t *)0x149e45;
    uStack_10 = uv_barrier_wait(unaff_RBX);
    puStack_50 = (uv_barrier_t *)0x149e52;
    iVar1 = uv_thread_join(&local_40);
    if (iVar1 != 0) goto LAB_00149e80;
    unaff_RBX = &local_38;
    puStack_50 = (uv_barrier_t *)0x149e63;
    uv_barrier_destroy(unaff_RBX);
    if ((uStack_c ^ uStack_10) == 1) {
      return 0;
    }
  }
  else {
    puStack_50 = (uv_barrier_t *)0x149e7b;
    run_test_barrier_2_cold_1();
LAB_00149e7b:
    puStack_50 = (uv_barrier_t *)0x149e80;
    run_test_barrier_2_cold_2();
LAB_00149e80:
    puStack_50 = (uv_barrier_t *)0x149e85;
    run_test_barrier_2_cold_3();
  }
  puStack_50 = (uv_barrier_t *)run_test_barrier_3;
  run_test_barrier_2_cold_4();
  uStack_60 = 0;
  uStack_58 = 0;
  uStack_54 = 0;
  uStack_80._16_8_ = 0;
  uStack_80._24_8_ = 0;
  uStack_80.__align = 0;
  uStack_80._8_8_ = 0;
  puStack_50 = unaff_RBX;
  iVar1 = uv_barrier_init(&uStack_80,2);
  if (iVar1 == 0) {
    iVar1 = uv_thread_create(&uStack_88,worker,&uStack_80);
    if (iVar1 != 0) goto LAB_00149f0d;
    unaff_RBX = &uStack_80;
    uStack_58 = uv_barrier_wait(unaff_RBX);
    iVar1 = uv_thread_join(&uStack_88);
    if (iVar1 == 0) {
      unaff_RBX = &uStack_80;
      uv_barrier_destroy(unaff_RBX);
      if ((uStack_54 ^ uStack_58) == 1) {
        return 0;
      }
      goto LAB_00149f17;
    }
  }
  else {
    run_test_barrier_3_cold_1();
LAB_00149f0d:
    run_test_barrier_3_cold_2();
  }
  run_test_barrier_3_cold_3();
LAB_00149f17:
  run_test_barrier_3_cold_4();
  barrier = &uStack_e8;
  puStack_a8 = unaff_RBX;
  iVar1 = uv_barrier_init(&uStack_e8,5);
  if (iVar1 == 0) {
    lVar2 = 0;
    do {
      barrier = (uv_barrier_t *)(uStack_c8.__size + lVar2);
      iVar1 = uv_thread_create((uv_thread_t *)&barrier->__align,serial_worker,&uStack_e8);
      if (iVar1 != 0) {
        run_test_barrier_serial_thread_cold_2();
        goto LAB_00149fa6;
      }
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x20);
    iVar1 = uv_barrier_wait(&uStack_e8);
    if (0 < iVar1) {
      uv_barrier_destroy(&uStack_e8);
    }
    lVar2 = 0;
    while( true ) {
      barrier = (uv_barrier_t *)(uStack_c8.__size + lVar2);
      iVar1 = uv_thread_join((uv_thread_t *)&barrier->__align);
      if (iVar1 != 0) break;
      lVar2 = lVar2 + 8;
      if (lVar2 == 0x20) {
        return 0;
      }
    }
LAB_00149fa6:
    run_test_barrier_serial_thread_cold_3();
  }
  run_test_barrier_serial_thread_cold_1();
  iVar1 = uv_barrier_wait(barrier);
  if (0 < iVar1) {
    uv_barrier_destroy(barrier);
  }
  uv_sleep(100);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(barrier_2) {
  uv_thread_t thread;
  worker_config wc;

  memset(&wc, 0, sizeof(wc));
  wc.delay = 100;

  ASSERT(0 == uv_barrier_init(&wc.barrier, 2));
  ASSERT(0 == uv_thread_create(&thread, worker, &wc));

  wc.main_barrier_wait_rval = uv_barrier_wait(&wc.barrier);

  ASSERT(0 == uv_thread_join(&thread));
  uv_barrier_destroy(&wc.barrier);

  ASSERT(1 == (wc.main_barrier_wait_rval ^ wc.worker_barrier_wait_rval));

  return 0;
}